

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int i2c_block_process_call(int pi,uint handle,uint reg,char *buf,uint count)

{
  int iVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  gpioExtent_t ext [1];
  int bytes;
  int in_stack_00000fc0;
  int in_stack_00000fc4;
  void *in_stack_00000fc8;
  int in_stack_00000fd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = pigpio_command_ext(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,0,
                             (gpioExtent_t *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),in_ESI);
  if (0 < iVar1) {
    iVar1 = recvMax(in_stack_00000fd4,in_stack_00000fc8,in_stack_00000fc4,in_stack_00000fc0);
  }
  _pmu(0);
  return iVar1;
}

Assistant:

int i2c_block_process_call(
   int pi, unsigned handle, unsigned reg, char *buf, unsigned count)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=reg
   p3=count
   ## extension ##
   char buf[count]
   */

   ext[0].size = count;
   ext[0].ptr = buf;

   bytes = pigpio_command_ext
      (pi, PI_CMD_I2CPK, handle, reg, count, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, 32, bytes);
   }

   _pmu(pi);

   return bytes;
}